

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O2

int dwarf_get_ranges_baseaddress
              (Dwarf_Debug dw_dbg,Dwarf_Die dw_die,Dwarf_Bool *dw_known_base,
              Dwarf_Unsigned *dw_baseaddress,Dwarf_Bool *dw_at_ranges_offset_present,
              Dwarf_Unsigned *dw_at_ranges_offset,Dwarf_Error *dw_error)

{
  Dwarf_CU_Context_conflict pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *msg;
  Dwarf_Unsigned DVar5;
  Dwarf_Bool DVar6;
  Dwarf_Error err;
  Dwarf_Unsigned *pDVar7;
  Dwarf_Signed DStack_70;
  Dwarf_Attribute attr;
  int local_5c;
  Dwarf_Bool haslowpc;
  Dwarf_Bool hasatranges;
  Dwarf_Unsigned die_ranges_offset;
  Dwarf_Addr local_48;
  Dwarf_Unsigned rangeoffset_local;
  Dwarf_Bool *local_38;
  
  die_ranges_offset = 0;
  if ((dw_dbg == (Dwarf_Debug)0x0) || (dw_dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_baseaddress()either null or it containsa stale Dwarf_Debug pointer"
    ;
    DStack_70 = 0x51;
    dw_dbg = (Dwarf_Debug)0x0;
    goto LAB_001d1c65;
  }
  if (dw_die == (Dwarf_Die)0x0) {
    if (dw_known_base != (Dwarf_Bool *)0x0) {
      *dw_known_base = 0;
      *dw_at_ranges_offset_present = 0;
    }
    if (dw_baseaddress == (Dwarf_Unsigned *)0x0) {
      return 0;
    }
    *dw_baseaddress = 0;
    *dw_at_ranges_offset = 0;
    return 0;
  }
  hasatranges = 0;
  haslowpc = 0;
  attr = (Dwarf_Attribute)0x0;
  rangeoffset_local = 0;
  local_48 = 0;
  local_38 = dw_known_base;
  iVar4 = dwarf_hasattr(dw_die,0x55,&hasatranges,dw_error);
  if (iVar4 == 0) {
    if (hasatranges == 0) goto LAB_001d1d11;
    iVar4 = dwarf_attr(dw_die,0x55,&attr,dw_error);
    if (iVar4 == 1) {
LAB_001d1cee:
      dwarf_dealloc_error(dw_dbg,*dw_error);
      *dw_error = (Dwarf_Error)0x0;
      err = (Dwarf_Error)0x0;
      goto LAB_001d1d01;
    }
    if (iVar4 == 0) {
      local_5c = dwarf_global_formref(attr,&rangeoffset_local,dw_error);
      dwarf_dealloc_attribute(attr);
      if (local_5c == 1) goto LAB_001d1cee;
      attr = (Dwarf_Attribute)0x0;
      die_ranges_offset = rangeoffset_local;
      iVar4 = dwarf_hasattr(dw_die,0x11,&haslowpc,dw_error);
      if ((iVar4 != 0) || (iVar4 = dwarf_lowpc(dw_die,&local_48,dw_error), iVar4 != 0)) {
        if (iVar4 == 1) {
          dwarf_dealloc_error(dw_dbg,*dw_error);
          *dw_error = (Dwarf_Error)0x0;
        }
        bVar2 = false;
        goto LAB_001d1df1;
      }
      bVar2 = false;
      bVar3 = false;
      DVar5 = local_48;
    }
    else {
      bVar2 = true;
LAB_001d1df1:
      bVar3 = true;
      DVar5 = 0;
    }
  }
  else {
    if (iVar4 == 1) {
      err = *dw_error;
LAB_001d1d01:
      dwarf_dealloc_error(dw_dbg,err);
      *dw_error = (Dwarf_Error)0x0;
    }
LAB_001d1d11:
    bVar3 = true;
    bVar2 = true;
    DVar5 = 0;
  }
  pDVar1 = dw_die->di_cu_context;
  if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
    if (bVar2) {
      DVar6 = pDVar1->cc_at_ranges_offset_present;
      pDVar7 = &pDVar1->cc_at_ranges_offset;
    }
    else {
      DVar6 = 1;
      pDVar7 = &die_ranges_offset;
    }
    if (dw_at_ranges_offset != (Dwarf_Unsigned *)0x0) {
      *dw_at_ranges_offset = *pDVar7;
    }
    if (dw_at_ranges_offset_present != (Dwarf_Bool *)0x0) {
      *dw_at_ranges_offset_present = DVar6;
    }
    DVar6 = 1;
    if (bVar3) {
      if (pDVar1->cc_low_pc_present == 0) {
        DVar5 = 0;
        DVar6 = 0;
      }
      else {
        DVar5 = pDVar1->cc_low_pc;
      }
    }
    if (dw_baseaddress == (Dwarf_Unsigned *)0x0) {
      return 0;
    }
    *dw_baseaddress = DVar5;
    *local_38 = DVar6;
    return 0;
  }
  msg = "DW_DLE_DIE_NO_CU_CONTEXT: in a call to dwarf_get_ranges_baseaddress";
  DStack_70 = 0x68;
LAB_001d1c65:
  _dwarf_error_string(dw_dbg,dw_error,DStack_70,msg);
  return 1;
}

Assistant:

int
dwarf_get_ranges_baseaddress(Dwarf_Debug dw_dbg,
    Dwarf_Die       dw_die,
    Dwarf_Bool     *dw_known_base,
    Dwarf_Unsigned *dw_baseaddress,
    Dwarf_Bool     *dw_at_ranges_offset_present,
    Dwarf_Unsigned *dw_at_ranges_offset,
    Dwarf_Error    *dw_error)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Unsigned local_ranges_offset = 0;
    Dwarf_Bool     local_ranges_offset_present = FALSE;
    Dwarf_Unsigned local_base_addr= 0;
    Dwarf_Bool     local_base_addr_present = FALSE;
    Dwarf_Bool     have_die_ranges_offset = FALSE;
    Dwarf_Unsigned die_ranges_offset = 0;
    Dwarf_Bool     have_die_base_addr = FALSE;
    Dwarf_Unsigned die_base_addr = 0;
    int            res = 0;

    CHECK_DBG(dw_dbg,dw_error,"dwarf_get_ranges_baseaddress()");
    if (!dw_die) {
        if (dw_known_base) {
            *dw_known_base = FALSE;
            *dw_at_ranges_offset_present = FALSE;
        }
        if (dw_baseaddress) {
            *dw_baseaddress = 0;
            *dw_at_ranges_offset = 0;
        }
        return DW_DLV_OK;
    }
    /*  If the DIE passed in has a DW_AT_ranges attribute
        we will use that DIE ranges offset.
        Otherwise we use the DW_AT_ranges from the
        CU DIE (if any)
        If the DIE passed in has a DW_AT_low_pc
        attribute we will use that as the ranges
        base address, otherwise we use the
        cu context base adddress (if present) ...
        which may be incorrect... ? */
    res = _dwarf_determine_die_range_offset(dw_dbg,
        dw_die,&have_die_ranges_offset,&die_ranges_offset,
        &have_die_base_addr,&die_base_addr,dw_error);
    if (res != DW_DLV_OK ) {
        if (res == DW_DLV_ERROR) {
            /*  Suppressing knowledge of any error */
            dwarf_dealloc_error(dw_dbg,*dw_error);
            *dw_error = 0;
        }
    }

    context = dw_die->di_cu_context;
    if (!context) {
        _dwarf_error_string(dw_dbg, dw_error,
            DW_DLE_DIE_NO_CU_CONTEXT,
            "DW_DLE_DIE_NO_CU_CONTEXT: in a call to "
            "dwarf_get_ranges_baseaddress");
        return DW_DLV_ERROR;
    }
    if (have_die_ranges_offset) {
        local_ranges_offset_present = have_die_ranges_offset;
        local_ranges_offset = die_ranges_offset;
    } else {
        local_ranges_offset_present =
            context->cc_at_ranges_offset_present;
        local_ranges_offset =
            context->cc_at_ranges_offset;
    }
    if (dw_at_ranges_offset) {
        *dw_at_ranges_offset = local_ranges_offset;
    }
    if (dw_at_ranges_offset_present) {
        *dw_at_ranges_offset_present = local_ranges_offset_present;
    }
    if (have_die_base_addr) {
        local_base_addr_present = have_die_base_addr;
        local_base_addr = die_base_addr;
    } else {
        if (context->cc_low_pc_present ) {
            local_base_addr_present = TRUE;
            local_base_addr = context->cc_low_pc;
        }
    }
    if (dw_baseaddress) {
        /*  Unless cc_low_pc_present is TRUE
            cc_low_pc is always zero, and it
            could be zero regardless. */

        *dw_baseaddress = local_base_addr;
        *dw_known_base = local_base_addr_present;
    }
    return DW_DLV_OK;
}